

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O3

Expression *
slang::ast::MemberAccessExpression::fromSelector
          (Compilation *compilation,Expression *expr,MemberSelector *selector,
          InvocationExpressionSyntax *invocation,ArrayOrRandomizeMethodExpressionSyntax *withClause,
          ASTContext *context,bool isFromLookupChain)

{
  uint uVar1;
  SourceRange *pSVar2;
  SymbolKind SVar3;
  size_t __n;
  int *piVar4;
  ulong uVar5;
  SourceRange range_00;
  optional<slang::SourceRange> sourceRange;
  optional<slang::SourceRange> sourceRange_00;
  SourceRange sourceRange_01;
  InvocationExpressionSyntax *syntax;
  InvocationExpressionSyntax *withClause_00;
  bool bVar6;
  int iVar7;
  Expression *pEVar8;
  Type *pTVar9;
  Type *pTVar10;
  Symbol *pSVar11;
  Diagnostic *pDVar12;
  FieldSymbol *args_2;
  MemberAccessExpression *pMVar13;
  Type *pTVar14;
  SourceLocation SVar15;
  DiagCode code;
  ClassType *ct;
  ValueSymbol *value;
  SourceRange sourceRange_02;
  string_view methodName;
  SourceRange sourceRange_03;
  SourceRange range;
  undefined1 in_stack_ffffffffffffff10;
  ASTContext *in_stack_ffffffffffffff18;
  ASTContext *context_00;
  SourceRange local_d8;
  InvocationExpressionSyntax *local_c8;
  InvocationExpressionSyntax *local_c0;
  SourceLocation local_b8;
  SourceLocation local_b0;
  SourceLocation local_a8;
  SourceLocation SStack_a0;
  undefined1 local_98;
  undefined7 uStack_97;
  SourceLocation local_88;
  SourceLocation SStack_80;
  undefined1 local_78;
  undefined7 uStack_77;
  FieldSymbol *local_68;
  undefined1 local_38;
  SourceLocation SVar16;
  
  __n = (selector->name)._M_len;
  if (__n == 0) {
switchD_004352de_caseD_24:
    goto LAB_00435383;
  }
  local_d8.startLoc = (expr->sourceRange).startLoc;
  local_d8.endLoc = (selector->nameRange).endLoc;
  local_b8 = local_d8.startLoc;
  local_b0 = local_d8.endLoc;
  if (expr->kind == Call) {
    if (isFromLookupChain) {
      sourceRange_01.endLoc = local_d8.endLoc;
      sourceRange_01.startLoc = local_d8.startLoc;
      ASTContext::addDiag(context,(DiagCode)0x390007,sourceRange_01);
    }
  }
  else if ((((expr->kind == NamedValue) && (piVar4 = *(int **)(expr + 1), *piVar4 == 0x46)) &&
           (*(size_t *)(piVar4 + 0x5a) == __n)) &&
          (iVar7 = bcmp(*(void **)(piVar4 + 0x5c),(selector->name)._M_str,__n), iVar7 == 0)) {
    in_stack_ffffffffffffff10 = SUB81(context,0);
    methodName._M_str = (char *)invocation;
    methodName._M_len = (size_t)"index";
    pEVar8 = CallExpression::fromBuiltInMethod
                       ((CallExpression *)compilation,(Compilation *)0x46,(SymbolKind)expr,
                        (Expression *)0x5,methodName,(InvocationExpressionSyntax *)withClause,
                        (ArrayOrRandomizeMethodExpressionSyntax *)context,in_stack_ffffffffffffff18)
    ;
    if (pEVar8 != (Expression *)0x0) {
      return pEVar8;
    }
  }
  pTVar14 = (expr->type).ptr;
  pTVar9 = pTVar14->canonical;
  local_c8 = invocation;
  local_c0 = (InvocationExpressionSyntax *)withClause;
  if (pTVar9 == (Type *)0x0) {
    Type::resolveCanonical(pTVar14);
    pTVar9 = pTVar14->canonical;
  }
  withClause_00 = local_c0;
  syntax = local_c8;
  switch((pTVar9->super_Symbol).kind) {
  case EnumType:
  case FixedSizeUnpackedArrayType:
  case DynamicArrayType:
  case AssociativeArrayType:
  case QueueType:
  case StringType:
  case EventType:
  case SequenceType:
    pEVar8 = tryBindSpecialMethod
                       (compilation,expr,selector,local_c8,
                        (ArrayOrRandomizeMethodExpressionSyntax *)local_c0,context);
    if (pEVar8 != (Expression *)0x0) {
      return pEVar8;
    }
    pEVar8 = CallExpression::fromSystemMethod
                       (compilation,expr,selector,syntax,
                        (ArrayOrRandomizeMethodExpressionSyntax *)withClause_00,context);
    return pEVar8;
  default:
    goto switchD_004352de_caseD_b;
  case PackedStructType:
  case UnpackedStructType:
  case PackedUnionType:
  case UnpackedUnionType:
    pTVar9 = (Type *)Symbol::scopeOrNull(&pTVar9->super_Symbol);
    break;
  case ClassType:
    if (*(int *)&pTVar9[1].super_Symbol.nextInScope != 0) {
      Scope::elaborate((Scope *)(pTVar9 + 1));
    }
    pTVar14 = (Type *)pTVar9[2].super_Symbol.name._M_len;
    if (pTVar14 != (Type *)0x0) {
      pTVar10 = pTVar14->canonical;
      if (pTVar10 == (Type *)0x0) {
        Type::resolveCanonical(pTVar14);
        pTVar10 = pTVar14->canonical;
      }
      if ((pTVar10->super_Symbol).kind == ErrorType) goto switchD_004352de_caseD_24;
    }
    pTVar9 = pTVar9 + 1;
    break;
  case CovergroupType:
    if (*(int *)&pTVar9[1].super_Symbol.nextInScope != 0) {
      Scope::elaborate((Scope *)(pTVar9 + 1));
    }
    pSVar11 = (Symbol *)pTVar9[1].super_Symbol.originatingSyntax;
LAB_004353b3:
    pTVar9 = (Type *)(pSVar11 + 1);
    break;
  case VoidType:
    pSVar11 = Expression::getSymbolReference(expr,true);
    if ((pSVar11 != (Symbol *)0x0) &&
       ((pSVar11->kind == CoverCross || (pSVar11->kind == Coverpoint)))) goto LAB_004353b3;
    goto switchD_004352de_caseD_b;
  case ErrorType:
    goto switchD_004352de_caseD_24;
  }
  args_2 = (FieldSymbol *)Scope::find((Scope *)pTVar9,selector->name);
  if (args_2 == (FieldSymbol *)0x0) {
    pEVar8 = tryBindSpecialMethod
                       (compilation,expr,selector,local_c8,
                        (ArrayOrRandomizeMethodExpressionSyntax *)local_c0,context);
    if (pEVar8 != (Expression *)0x0) {
      return pEVar8;
    }
    pDVar12 = ASTContext::addDiag(context,(DiagCode)0x3a000a,(selector->nameRange).startLoc);
    Diagnostic::operator<<(pDVar12,expr->sourceRange);
    Diagnostic::operator<<(pDVar12,selector->name);
    ast::operator<<(pDVar12,(expr->type).ptr);
    goto LAB_00435383;
  }
  SVar3 = (args_2->super_VariableSymbol).super_ValueSymbol.super_Symbol.kind;
  uVar1 = SVar3 - ClassProperty;
  if (0x1f < uVar1) {
LAB_004355af:
    if (SVar3 == EnumValue) {
      sourceRange_03.endLoc = (SourceLocation)0x0;
      sourceRange_03.startLoc = local_b0;
      pMVar13 = (MemberAccessExpression *)
                ValueExpressionBase::fromSymbol
                          ((ValueExpressionBase *)context,(ASTContext *)args_2,(Symbol *)0x0,
                           (HierarchicalReference *)local_b8,sourceRange_03,false,
                           (bool)in_stack_ffffffffffffff10);
    }
    else if (SVar3 == Field) {
      pTVar14 = DeclaredType::getType
                          (&(args_2->super_VariableSymbol).super_ValueSymbol.declaredType);
      pMVar13 = BumpAllocator::
                emplace<slang::ast::MemberAccessExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::FieldSymbol_const&,slang::SourceRange&>
                          (&compilation->super_BumpAllocator,pTVar14,expr,args_2,&local_d8);
    }
    else {
      bVar6 = Symbol::isValue((Symbol *)args_2);
      if (!bVar6) {
        pDVar12 = ASTContext::addDiag(context,(DiagCode)0x630007,selector->dotLocation);
        Diagnostic::operator<<(pDVar12,selector->nameRange);
        Diagnostic::operator<<(pDVar12,expr->sourceRange);
        Diagnostic::operator<<(pDVar12,selector->name);
LAB_0043570e:
        ast::operator<<(pDVar12,(expr->type).ptr);
        goto LAB_00435383;
      }
      pTVar14 = DeclaredType::getType
                          (&(args_2->super_VariableSymbol).super_ValueSymbol.declaredType);
      pMVar13 = BumpAllocator::
                emplace<slang::ast::MemberAccessExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::ValueSymbol_const&,slang::SourceRange&>
                          (&compilation->super_BumpAllocator,pTVar14,expr,(ValueSymbol *)args_2,
                           &local_d8);
    }
    return &pMVar13->super_Expression;
  }
  if ((0xb0000200U >> (uVar1 & 0x1f) & 1) == 0) {
    pSVar2 = &selector->nameRange;
    if (uVar1 == 0) {
      local_88 = pSVar2->startLoc;
      SStack_80 = (selector->nameRange).endLoc;
      local_78 = 1;
      sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._17_7_ = uStack_77;
      sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_engaged = true;
      sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._9_7_ = SStack_80._1_7_;
      sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._0_9_ = *(unkbyte9 *)pSVar2;
      Lookup::ensureVisible((Symbol *)args_2,context,sourceRange_00);
      if ((args_2->super_VariableSymbol).lifetime != Automatic) {
LAB_00435692:
        pTVar14 = DeclaredType::getType
                            (&(args_2->super_VariableSymbol).super_ValueSymbol.declaredType);
        pMVar13 = BumpAllocator::
                  emplace<slang::ast::MemberAccessExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::ClassPropertySymbol_const&,slang::SourceRange&>
                            (&compilation->super_BumpAllocator,pTVar14,expr,
                             (ClassPropertySymbol *)args_2,&local_d8);
        return &pMVar13->super_Expression;
      }
      uVar5 = (context->flags).m_bits;
      if ((uVar5 & 0x20) == 0) {
        if (((uint)uVar5 >> 0x10 & 1) == 0) goto LAB_00435692;
        goto LAB_00435734;
      }
LAB_0043574b:
      code.subsystem = Expressions;
      code.code = 0x4c;
      SVar15 = local_d8.endLoc;
      SVar16 = local_d8.startLoc;
    }
    else {
      if (uVar1 != 1) goto LAB_004355af;
      local_a8 = pSVar2->startLoc;
      SStack_a0 = (selector->nameRange).endLoc;
      local_98 = 1;
      context_00 = (ASTContext *)CONCAT71(uStack_97,1);
      sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._9_7_ = SStack_a0._1_7_;
      sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._0_9_ = *(unkbyte9 *)pSVar2;
      sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._16_8_ = context_00;
      Lookup::ensureVisible((Symbol *)args_2,context,sourceRange);
      if ((*(byte *)((long)&(args_2->super_VariableSymbol).super_ValueSymbol.driverMap.field_0 +
                    0x44) & 4) != 0) {
LAB_0043557a:
        local_38 = 0;
        range_00.endLoc._0_1_ = local_d8.endLoc._0_1_;
        range_00.startLoc = local_d8.startLoc;
        range_00.endLoc._1_7_ = local_d8.endLoc._1_7_;
        local_68 = args_2;
        pEVar8 = CallExpression::fromLookup
                           ((CallExpression *)compilation,(Compilation *)&stack0xffffffffffffff98,
                            (Subroutine *)expr,(Expression *)local_c8,local_c0,
                            (ArrayOrRandomizeMethodExpressionSyntax *)context,range_00,context_00);
        return pEVar8;
      }
      uVar5 = (context->flags).m_bits;
      if ((uVar5 & 0x20) != 0) goto LAB_0043574b;
      if (((uint)uVar5 >> 0x10 & 1) == 0) goto LAB_0043557a;
LAB_00435734:
      code.subsystem = Expressions;
      code.code = 0x3c;
      SVar15 = local_d8.endLoc;
      SVar16 = local_d8.startLoc;
    }
  }
  else {
    if (((context->flags).m_bits & 0x20) == 0) {
      pMVar13 = BumpAllocator::
                emplace<slang::ast::MemberAccessExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Symbol_const&,slang::SourceRange&>
                          (&compilation->super_BumpAllocator,compilation->voidType,expr,
                           (Symbol *)args_2,&local_d8);
      return &pMVar13->super_Expression;
    }
    code.subsystem = Expressions;
    code.code = 0x4c;
    SVar15 = local_b0;
    SVar16 = local_b8;
  }
  sourceRange_02.endLoc = SVar15;
  sourceRange_02.startLoc = SVar16;
  ASTContext::addDiag(context,code,sourceRange_02);
LAB_00435383:
  pEVar8 = Expression::badExpr(compilation,expr);
  return pEVar8;
switchD_004352de_caseD_b:
  pEVar8 = tryBindSpecialMethod
                     (compilation,expr,selector,local_c8,
                      (ArrayOrRandomizeMethodExpressionSyntax *)local_c0,context);
  if (pEVar8 != (Expression *)0x0) {
    return pEVar8;
  }
  pDVar12 = ASTContext::addDiag(context,(DiagCode)0x650007,selector->dotLocation);
  Diagnostic::operator<<(pDVar12,expr->sourceRange);
  Diagnostic::operator<<(pDVar12,selector->nameRange);
  goto LAB_0043570e;
}

Assistant:

Expression& MemberAccessExpression::fromSelector(
    Compilation& compilation, Expression& expr, const LookupResult::MemberSelector& selector,
    const InvocationExpressionSyntax* invocation,
    const ArrayOrRandomizeMethodExpressionSyntax* withClause, const ASTContext& context,
    bool isFromLookupChain) {

    // If the selector name is invalid just give up early.
    if (selector.name.empty())
        return badExpr(compilation, &expr);

    // The source range of the entire member access starts from the value being selected.
    SourceRange range{expr.sourceRange.start(), selector.nameRange.end()};

    // Special cases for built-in iterator methods that don't cleanly fit the general
    // mold of looking up members via the type of the expression.
    if (expr.kind == ExpressionKind::NamedValue) {
        auto& sym = expr.as<NamedValueExpression>().symbol;
        auto symKind = sym.kind;
        if (symKind == SymbolKind::Iterator) {
            auto& iter = sym.as<IteratorSymbol>();
            if (iter.indexMethodName == selector.name) {
                auto result = CallExpression::fromBuiltInMethod(compilation, symKind, expr,
                                                                "index"sv, invocation, withClause,
                                                                context);
                if (result)
                    return *result;
            }
        }
    }
    else if (expr.kind == ExpressionKind::Call && isFromLookupChain) {
        // It's an error to dot select from a call expression that
        // doesn't include parentheses, which it doesn't iff
        // isFromLookupChain is set.
        context.addDiag(diag::ChainedMethodParens, range);
    }

    auto errorIfNotProcedural = [&] {
        if (context.flags.has(ASTFlags::NonProcedural)) {
            context.addDiag(diag::DynamicNotProcedural, range);
            return true;
        }
        return false;
    };
    auto errorIfAssertion = [&] {
        if (context.flags.has(ASTFlags::AssertionExpr)) {
            context.addDiag(diag::ClassMemberInAssertion, range);
            return true;
        }
        return false;
    };

    // This might look like a member access but actually be a built-in type method.
    const Type& type = expr.type->getCanonicalType();
    const Scope* scope = nullptr;
    switch (type.kind) {
        case SymbolKind::PackedStructType:
        case SymbolKind::UnpackedStructType:
        case SymbolKind::PackedUnionType:
        case SymbolKind::UnpackedUnionType:
            scope = &type.as<Scope>();
            break;
        case SymbolKind::ClassType: {
            auto& ct = type.as<ClassType>();
            if (auto base = ct.getBaseClass(); base && base->isError())
                return badExpr(compilation, &expr);

            scope = &ct;
            break;
        }
        case SymbolKind::CovergroupType:
            scope = &type.as<CovergroupType>().getBody();
            break;
        case SymbolKind::EnumType:
        case SymbolKind::StringType:
        case SymbolKind::FixedSizeUnpackedArrayType:
        case SymbolKind::DynamicArrayType:
        case SymbolKind::AssociativeArrayType:
        case SymbolKind::QueueType:
        case SymbolKind::EventType:
        case SymbolKind::SequenceType: {
            if (auto result = tryBindSpecialMethod(compilation, expr, selector, invocation,
                                                   withClause, context)) {
                return *result;
            }

            return CallExpression::fromSystemMethod(compilation, expr, selector, invocation,
                                                    withClause, context);
        }
        case SymbolKind::ErrorType:
            return badExpr(compilation, &expr);
        case SymbolKind::VoidType:
            if (auto sym = expr.getSymbolReference()) {
                if (sym->kind == SymbolKind::Coverpoint) {
                    scope = &sym->as<CoverpointSymbol>();
                    break;
                }
                else if (sym->kind == SymbolKind::CoverCross) {
                    scope = &sym->as<CoverCrossSymbol>();
                    break;
                }
            }
            [[fallthrough]];
        default: {
            if (auto result = tryBindSpecialMethod(compilation, expr, selector, invocation,
                                                   withClause, context)) {
                return *result;
            }

            auto& diag = context.addDiag(diag::InvalidMemberAccess, selector.dotLocation);
            diag << expr.sourceRange;
            diag << selector.nameRange;
            diag << *expr.type;
            return badExpr(compilation, &expr);
        }
    }

    const Symbol* member = scope->find(selector.name);
    if (!member) {
        if (auto result = tryBindSpecialMethod(compilation, expr, selector, invocation, withClause,
                                               context)) {
            return *result;
        }

        auto& diag = context.addDiag(diag::UnknownMember, selector.nameRange.start());
        diag << expr.sourceRange;
        diag << selector.name;
        diag << *expr.type;
        return badExpr(compilation, &expr);
    }

    switch (member->kind) {
        case SymbolKind::Field: {
            auto& field = member->as<FieldSymbol>();
            return *compilation.emplace<MemberAccessExpression>(field.getType(), expr, field,
                                                                range);
        }
        case SymbolKind::ClassProperty: {
            Lookup::ensureVisible(*member, context, selector.nameRange);
            auto& prop = member->as<ClassPropertySymbol>();
            if (prop.lifetime == VariableLifetime::Automatic &&
                (errorIfNotProcedural() || errorIfAssertion())) {
                return badExpr(compilation, &expr);
            }

            return *compilation.emplace<MemberAccessExpression>(prop.getType(), expr, prop, range);
        }
        case SymbolKind::Subroutine: {
            Lookup::ensureVisible(*member, context, selector.nameRange);
            auto& sub = member->as<SubroutineSymbol>();
            if (!sub.flags.has(MethodFlags::Static) &&
                (errorIfNotProcedural() || errorIfAssertion())) {
                return badExpr(compilation, &expr);
            }

            return CallExpression::fromLookup(compilation, &sub, &expr, invocation, withClause,
                                              range, context);
        }
        case SymbolKind::ConstraintBlock:
        case SymbolKind::Coverpoint:
        case SymbolKind::CoverCross:
        case SymbolKind::CoverageBin: {
            if (errorIfNotProcedural())
                return badExpr(compilation, &expr);
            return *compilation.emplace<MemberAccessExpression>(compilation.getVoidType(), expr,
                                                                *member, range);
        }
        case SymbolKind::EnumValue:
            // The thing being selected from doesn't actually matter, since the
            // enum value is a constant.
            return ValueExpressionBase::fromSymbol(context, *member, nullptr, range);
        default: {
            if (member->isValue()) {
                auto& value = member->as<ValueSymbol>();
                return *compilation.emplace<MemberAccessExpression>(value.getType(), expr, value,
                                                                    range);
            }

            auto& diag = context.addDiag(diag::InvalidClassAccess, selector.dotLocation);
            diag << selector.nameRange;
            diag << expr.sourceRange;
            diag << selector.name;
            diag << *expr.type;
            return badExpr(compilation, &expr);
        }
    }
}